

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roundtrip.cpp
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
(anonymous_namespace)::roundtrip<std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *out;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_000001f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000200;
  
  std::__cxx11::string::string((string *)in_RDI);
  roundtrip_into<std::__cxx11::string,std::__cxx11::string>(in_stack_00000200,in_stack_000001f8);
  return in_RDI;
}

Assistant:

T roundtrip(const T& in)
{
  T out;
  roundtrip_into(in, out);
  return out;
}